

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall
SimpleLogger::put(SimpleLogger *this,int level,char *source_file,char *func_name,size_t line_number,
                 char *format,...)

{
  char cVar1;
  pointer pLVar2;
  size_t start_pos;
  uint uVar3;
  char in_AL;
  uint uVar4;
  int iVar5;
  size_t ii;
  long lVar6;
  time_point now;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  char *__format;
  ulong uVar11;
  ulong uVar12;
  size_t __maxlen;
  ulong uVar13;
  ulong uVar14;
  LogElem *this_00;
  long *in_FS_OFFSET;
  bool bVar15;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  unique_lock<std::mutex> l;
  va_list args;
  TimeInfo lt;
  undefined1 local_10e8 [48];
  undefined8 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  char msg [4096];
  
  if (in_AL != '\0') {
    local_10b8 = in_XMM0_Qa;
    local_10a8 = in_XMM1_Qa;
    local_1098 = in_XMM2_Qa;
    local_1088 = in_XMM3_Qa;
    local_1078 = in_XMM4_Qa;
    local_1068 = in_XMM5_Qa;
    local_1058 = in_XMM6_Qa;
    local_1048 = in_XMM7_Qa;
  }
  if ((this->curLogLevel).super___atomic_base<int>._M_i < level) {
    return;
  }
  if (((&this->field_0x58)[*(long *)(*(long *)&this->fs + -0x18)] & 5) != 0) {
    return;
  }
  lVar7 = *in_FS_OFFSET;
  if (*(char *)(lVar7 + -0x18) == '\0') {
    ThreadWrapper::ThreadWrapper((ThreadWrapper *)(lVar7 + -0x28));
    __cxa_thread_atexit(ThreadWrapper::~ThreadWrapper,(ThreadWrapper *)(lVar7 + -0x28),&__dso_handle
                       );
    *(undefined1 *)(lVar7 + -0x18) = 1;
  }
  uVar13 = (ulong)(uint)tid_digits.super___atomic_base<int>._M_i;
  if (*(char *)(lVar7 + -0x10) == '\0') {
    *(undefined4 *)(lVar7 + -0x14) = *(undefined4 *)(lVar7 + -0x20);
    *(undefined1 *)(lVar7 + -0x10) = 1;
  }
  lVar6 = 0;
  lVar10 = 0;
  while (source_file != (char *)0x0) {
    cVar1 = source_file[lVar6];
    lVar9 = lVar6;
    if (((cVar1 != '/') && (cVar1 != '\\')) && (lVar9 = lVar10, cVar1 == '\0')) goto LAB_001bce0f;
    lVar6 = lVar6 + 1;
    lVar10 = lVar9;
  }
  lVar10 = 0;
LAB_001bce0f:
  now.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  SimpleLoggerMgr::TimeInfo::TimeInfo(&lt,now);
  uVar4 = this->tzGap;
  uVar3 = -uVar4;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  uVar4 = snprintf(msg,0x1000,"%04d-%02d-%02dT%02d:%02d:%02d.%03d_%03d%c%02d:%02d [%*u] [%s] ",
                   (ulong)(uint)lt.year,(ulong)(uint)lt.month,(ulong)(uint)lt.day,
                   (ulong)(uint)lt.hour,(ulong)(uint)lt.min,(ulong)(uint)lt.sec,(ulong)(uint)lt.msec
                   ,(ulong)(uint)lt.usec,(ulong)(((int)uVar4 >> 0x1f) * -2 + 0x2b),
                   (ulong)uVar3 / 0x3c,(ulong)uVar3 % 0x3c,uVar13,(ulong)*(uint *)(lVar7 + -0x14),
                   _ZZN12SimpleLogger3putEiPKcS1_mS1_zE8lv_names_rel +
                   *(int *)(_ZZN12SimpleLogger3putEiPKcS1_mS1_zE8lv_names_rel + (long)level * 4));
  uVar11 = 0x1000;
  if (uVar4 < 0x1000) {
    uVar11 = (ulong)uVar4;
  }
  uVar14 = 0x1000 - uVar11;
  if (0xfff < uVar4) {
    uVar14 = 0;
  }
  args[0].gp_offset = 0x30;
  args[0].fp_offset = 0x30;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].reg_save_area = local_10e8;
  iVar5 = vsnprintf(msg + uVar11,uVar14,format,args);
  uVar12 = (long)iVar5;
  if (uVar14 < (ulong)(long)iVar5) {
    uVar12 = uVar14;
  }
  uVar12 = uVar12 + uVar11;
  uVar11 = uVar14 - uVar12;
  if (uVar14 < uVar12) {
    uVar11 = 0;
  }
  if (func_name == (char *)0x0 || source_file == (char *)0x0) {
    iVar5 = snprintf(msg + uVar12,uVar11,"\n");
  }
  else {
    lVar6 = lVar10 + 1;
    if (lVar10 == 0) {
      lVar6 = 0;
    }
    iVar5 = snprintf(msg + uVar12,uVar11,"\t[%s:%zu, %s()]\n",source_file + lVar6,line_number);
  }
  uVar14 = (long)iVar5;
  if (uVar11 < (ulong)(long)iVar5) {
    uVar14 = uVar11;
  }
  pLVar2 = (this->logs).
           super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar11 = ((long)(this->logs).
                  super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pLVar2) / 0x1010;
  do {
    start_pos = (this->cursor).super___atomic_base<unsigned_long>._M_i;
    LOCK();
    bVar15 = start_pos == (this->cursor).super___atomic_base<unsigned_long>._M_i;
    if (bVar15) {
      (this->cursor).super___atomic_base<unsigned_long>._M_i = (start_pos + 1) % uVar11;
    }
    UNLOCK();
  } while (!bVar15);
  this_00 = pLVar2 + start_pos;
  while (((this_00->status)._M_i & ~DIRTY) != CLEAN) {
    sched_yield();
  }
  if (((this_00->status)._M_i == DIRTY) && (bVar15 = flush(this,start_pos), !bVar15)) {
    while ((this_00->status)._M_i == DIRTY) {
      sched_yield();
    }
  }
  LogElem::write(this_00,(int)uVar14 + (int)uVar12,msg,uVar11);
  if ((this->curDispLevel).super___atomic_base<int>._M_i < level) {
    return;
  }
  uVar4 = snprintf(msg,0x1000,
                   " [\x1b[33m%02d\x1b[0m:\x1b[33m%02d\x1b[0m:\x1b[33m%02d\x1b[0m.\x1b[33m%03d\x1b[0m \x1b[33m%03d\x1b[0m] [tid \x1b[1;34m%*u\x1b[0m] [%s] "
                   ,(ulong)(uint)lt.hour,(ulong)(uint)lt.min,(ulong)(uint)lt.sec,
                   (ulong)(uint)lt.msec,(ulong)(uint)lt.usec,uVar13,(ulong)*(uint *)(lVar7 + -0x14),
                   _ZZN12SimpleLogger3putEiPKcS1_mS1_zE16colored_lv_names_rel +
                   *(int *)(_ZZN12SimpleLogger3putEiPKcS1_mS1_zE16colored_lv_names_rel +
                           (long)level * 4));
  uVar13 = 0x1000;
  if (uVar4 < 0x1000) {
    uVar13 = (ulong)uVar4;
  }
  uVar11 = 0;
  if (uVar4 < 0x1000) {
    uVar11 = 0x1000 - uVar13;
  }
  if (func_name == (char *)0x0 || source_file == (char *)0x0) {
    iVar5 = snprintf(msg + uVar13,uVar11,"\n");
  }
  else {
    lVar7 = lVar10 + 1;
    if (lVar10 == 0) {
      lVar7 = 0;
    }
    iVar5 = snprintf(msg + uVar13,uVar11,
                     "[\x1b[32m%s\x1b[0m:\x1b[1;31m%zu\x1b[0m, \x1b[36m%s()\x1b[0m]\n",
                     source_file + lVar7,line_number,func_name);
  }
  uVar14 = (long)iVar5;
  if (uVar11 < (ulong)(long)iVar5) {
    uVar14 = uVar11;
  }
  uVar14 = uVar14 + uVar13;
  args[0].reg_save_area = local_10e8;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x30;
  args[0].fp_offset = 0x30;
  if (level == 0) {
    __format = "\x1b[1;33m";
  }
  else {
    if (level != 1) goto LAB_001bd227;
    __format = "\x1b[1;31m";
  }
  bVar15 = uVar11 < uVar14;
  uVar11 = uVar11 - uVar14;
  if (bVar15) {
    uVar11 = 0;
  }
  iVar5 = snprintf(msg + uVar14,uVar11,__format);
  uVar13 = (long)iVar5;
  if (uVar11 < (ulong)(long)iVar5) {
    uVar13 = uVar11;
  }
  uVar14 = uVar14 + uVar13;
LAB_001bd227:
  uVar13 = uVar11 - uVar14;
  if (uVar11 < uVar14) {
    uVar13 = 0;
  }
  iVar5 = vsnprintf(msg + uVar14,uVar13,format,args);
  uVar11 = (long)iVar5;
  if (uVar13 < (ulong)(long)iVar5) {
    uVar11 = uVar13;
  }
  uVar11 = uVar11 + uVar14;
  __maxlen = uVar13 - uVar11;
  if (uVar13 < uVar11) {
    __maxlen = 0;
  }
  snprintf(msg + uVar11,__maxlen,"\x1b[0m");
  std::unique_lock<std::mutex>::unique_lock(&l,&SimpleLoggerMgr::displayLock);
  poVar8 = std::operator<<((ostream *)&std::cout,msg);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::unique_lock<std::mutex>::unlock(&l);
  std::unique_lock<std::mutex>::~unique_lock(&l);
  return;
}

Assistant:

void SimpleLogger::put(int level,
                       const char* source_file,
                       const char* func_name,
                       size_t line_number,
                       const char* format,
                       ...)
{
    if (level > curLogLevel.load(MOR)) return;
    if (!fs) return;

    static const char* lv_names[7] = {"====",
                                      "FATL", "ERRO", "WARN",
                                      "INFO", "DEBG", "TRAC"};
    char msg[MSG_SIZE];
    thread_local ThreadWrapper thread_wrapper;
#ifdef __linux__
    const int TID_DIGITS = tid_digits;
    thread_local uint32_t tid_hash = thread_wrapper.myTid;
#else
    thread_local std::thread::id tid = std::this_thread::get_id();
    thread_local uint32_t tid_hash = std::hash<std::thread::id>{}(tid) % 0x10000;
#endif

    // Print filename part only (excluding directory path).
    size_t last_slash = 0;
    for (size_t ii=0; source_file && source_file[ii] != 0; ++ii) {
        if (source_file[ii] == '/' || source_file[ii] == '\\') last_slash = ii;
    }

    SimpleLoggerMgr::TimeInfo lt( std::chrono::system_clock::now() );
    int tz_gap_abs = (tzGap < 0) ? (tzGap * -1) : (tzGap);

    // [time] [tid] [log type] [user msg] [stack info]
    // Timestamp: ISO 8601 format.
    size_t cur_len = 0;
    size_t avail_len = MSG_SIZE;
    size_t msg_len = 0;

#ifdef __linux__
    _snprintf( msg, avail_len, cur_len, msg_len,
               "%04d-%02d-%02dT%02d:%02d:%02d.%03d_%03d%c%02d:%02d "
               "[%*u] "
               "[%s] ",
               lt.year, lt.month, lt.day,
               lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
               (tzGap >= 0)?'+':'-', tz_gap_abs / 60, tz_gap_abs % 60,
               TID_DIGITS, tid_hash,
               lv_names[level] );
#else
    _snprintf( msg, avail_len, cur_len, msg_len,
               "%04d-%02d-%02dT%02d:%02d:%02d.%03d_%03d%c%02d:%02d "
               "[%04x] "
               "[%s] ",
               lt.year, lt.month, lt.day,
               lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
               (tzGap >= 0)?'+':'-', tz_gap_abs / 60, tz_gap_abs % 60,
               tid_hash,
               lv_names[level] );
#endif

    va_list args;
    va_start(args, format);
    _vsnprintf(msg, avail_len, cur_len, msg_len, format, args);
    va_end(args);

    if (source_file && func_name) {
        _snprintf( msg, avail_len, cur_len, msg_len,
                   "\t[%s:%zu, %s()]\n",
                   source_file + ((last_slash)?(last_slash+1):0),
                   line_number, func_name );
    } else {
        _snprintf(msg, avail_len, cur_len, msg_len, "\n");
    }

    size_t num = logs.size();
    uint64_t cursor_exp = 0, cursor_val = 0;
    LogElem* ll = nullptr;
    do {
        cursor_exp = cursor.load(MOR);
        cursor_val = (cursor_exp + 1) % num;
        ll = &logs[cursor_exp];
    } while ( !cursor.compare_exchange_strong(cursor_exp, cursor_val, MOR) );
    while ( !ll->available() ) std::this_thread::yield();

    if (ll->needToFlush()) {
        // Allow only one thread to flush.
        if (!flush(cursor_exp)) {
            // Other threads: wait.
            while (ll->needToFlush()) std::this_thread::yield();
        }
    }
    ll->write(cur_len, msg);

    if (level > curDispLevel) return;

    // Console part.
    static const char* colored_lv_names[7] =
                       { _CL_B_BROWN("===="),
                         _CL_WHITE_FG_RED_BG("FATL"),
                         _CL_B_RED("ERRO"),
                         _CL_B_MAGENTA("WARN"),
                         "INFO",
                         _CL_D_GRAY("DEBG"),
                         _CL_D_GRAY("TRAC") };

    cur_len = 0;
    avail_len = MSG_SIZE;
#ifdef __linux__
    _snprintf( msg, avail_len, cur_len, msg_len,
               " [" _CL_BROWN("%02d") ":" _CL_BROWN("%02d") ":" _CL_BROWN("%02d") "."
               _CL_BROWN("%03d") " " _CL_BROWN("%03d")
               "] [tid " _CL_B_BLUE("%*u") "] "
               "[%s] ",
               lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
               TID_DIGITS, tid_hash,
               colored_lv_names[level] );
#else
    _snprintf( msg, avail_len, cur_len, msg_len,
               " [" _CL_BROWN("%02d") ":" _CL_BROWN("%02d") ":" _CL_BROWN("%02d") "."
               _CL_BROWN("%03d") " " _CL_BROWN("%03d")
               "] [tid " _CL_B_BLUE("%04x") "] "
               "[%s] ",
               lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
               tid_hash,
               colored_lv_names[level] );
#endif

    if (source_file && func_name) {
        _snprintf( msg, avail_len, cur_len, msg_len,
                   "[" _CL_GREEN("%s") ":" _CL_B_RED("%zu")
                   ", " _CL_CYAN("%s()") "]\n",
                   source_file + ((last_slash)?(last_slash+1):0),
                   line_number, func_name );
    } else {
        _snprintf(msg, avail_len, cur_len, msg_len, "\n");
    }

    va_start(args, format);

#ifndef LOGGER_NO_COLOR
    if (level == 0) {
        _snprintf(msg, avail_len, cur_len, msg_len, _CLM_B_BROWN);
    } else if (level == 1) {
        _snprintf(msg, avail_len, cur_len, msg_len, _CLM_B_RED);
    }
#endif

    _vsnprintf(msg, avail_len, cur_len, msg_len, format, args);

#ifndef LOGGER_NO_COLOR
    _snprintf(msg, avail_len, cur_len, msg_len, _CLM_END);
#endif

    va_end(args);
    (void)cur_len;

    std::unique_lock<std::mutex> l(SimpleLoggerMgr::displayLock);
    std::cout << msg << std::endl;
    l.unlock();
}